

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O0

void __thiscall
r_exec::IPGMContext::addReference
          (IPGMContext *this,View *destination,uint16_t write_index,Code *referenced_object)

{
  Atom *this_00;
  Atom local_30 [6];
  ushort local_2a;
  Code *pCStack_28;
  uint16_t r_ptr_index;
  Code *referenced_object_local;
  View *pVStack_18;
  uint16_t write_index_local;
  View *destination_local;
  IPGMContext *this_local;
  
  local_2a = (ushort)((destination->super_View).references[0] != (Code *)0x0);
  (destination->super_View).references[local_2a] = referenced_object;
  pCStack_28 = referenced_object;
  referenced_object_local._6_2_ = write_index;
  pVStack_18 = destination;
  destination_local = (View *)this;
  r_code::Atom::RPointer((ushort)local_30);
  this_00 = r_code::View::code(&pVStack_18->super_View,referenced_object_local._6_2_);
  r_code::Atom::operator=(this_00,local_30);
  r_code::Atom::~Atom(local_30);
  return;
}

Assistant:

void addReference(View *destination, uint16_t write_index, Code *referenced_object) const   // view references are set in order (index 0 then 1).
    {
        uint16_t r_ptr_index;

        if (destination->references[0]) { // first ref already in place.
            r_ptr_index = 1;
        } else {
            r_ptr_index = 0;
        }

        destination->references[r_ptr_index] = referenced_object;
        destination->code(write_index) = Atom::RPointer(r_ptr_index);
    }